

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O3

void __thiscall
Assimp::MD5::MD5MeshParser::MD5MeshParser(MD5MeshParser *this,SectionList *mSections)

{
  char *pcVar1;
  pointer this_00;
  VertexList *this_01;
  string *psVar2;
  pointer pSVar3;
  pointer pEVar4;
  pointer pMVar5;
  pointer pBVar6;
  int iVar7;
  Logger *pLVar8;
  FaceList *this_02;
  uint *puVar9;
  pointer pWVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  size_type sVar21;
  char *pcVar22;
  long lVar23;
  pointer pSVar24;
  Element *elem;
  pointer pEVar25;
  pointer paVar26;
  byte *pbVar27;
  pointer local_540;
  undefined1 local_4e8 [24];
  pointer local_4d0;
  pointer local_4c0;
  vector<aiFace,_std::allocator<aiFace>_> local_4b8;
  undefined1 local_49b [955];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  float local_c8;
  float local_c0;
  float local_b8;
  undefined8 local_b4;
  undefined8 uStack_ac;
  float local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  float local_3c;
  
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar8 = DefaultLogger::get();
  Logger::debug(pLVar8,"MD5MeshParser begin");
  pSVar24 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar3 = (mSections->
           super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pSVar24 == pSVar3) {
      pLVar8 = DefaultLogger::get();
      Logger::debug(pLVar8,"MD5MeshParser end");
      return;
    }
    psVar2 = &pSVar24->mName;
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 == 0) {
      pcVar22 = (pSVar24->mGlobalValue)._M_dataplus._M_p;
      cVar11 = *pcVar22;
      if ((byte)(cVar11 - 0x3aU) < 0xf6) {
        sVar21 = 0;
      }
      else {
        uVar18 = 0;
        do {
          pcVar22 = pcVar22 + 1;
          uVar18 = (uint)(byte)(cVar11 - 0x30) + uVar18 * 10;
          cVar11 = *pcVar22;
        } while (0xf5 < (byte)(cVar11 - 0x3aU));
        sVar21 = (size_type)uVar18;
      }
      std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::reserve
                (&this->mMeshes,sVar21);
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar7 == 0) {
        pcVar22 = (pSVar24->mGlobalValue)._M_dataplus._M_p;
        cVar11 = *pcVar22;
        if ((byte)(cVar11 - 0x3aU) < 0xf6) {
          sVar21 = 0;
        }
        else {
          uVar18 = 0;
          do {
            pcVar22 = pcVar22 + 1;
            uVar18 = (uint)(byte)(cVar11 - 0x30) + uVar18 * 10;
            cVar11 = *pcVar22;
          } while (0xf5 < (byte)(cVar11 - 0x3aU));
          sVar21 = (size_type)uVar18;
        }
        std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::reserve
                  (&this->mJoints,sVar21);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar7 == 0) {
          pEVar4 = (pSVar24->mElements).
                   super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pEVar25 = (pSVar24->mElements).
                         super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                         ._M_impl.super__Vector_impl_data._M_start; pEVar25 != pEVar4;
              pEVar25 = pEVar25 + 1) {
            memset((BoneDesc *)local_4e8,0,0x4b4);
            memset(local_4e8 + 5,0x1b,0x3ff);
            local_e0._0_4_ = 0.0;
            local_e0._4_4_ = 0.0;
            local_e0[8] = '\0';
            local_e0[9] = '\0';
            local_e0[10] = '\0';
            local_e0[0xb] = '\0';
            local_e0[0xc] = '\0';
            local_e0[0xd] = '\0';
            local_e0[0xe] = '\0';
            local_e0[0xf] = '\0';
            local_d0._0_4_ = 0.0;
            local_d0._4_4_ = 0.0;
            local_c8 = 1.0;
            local_c0 = 0.0;
            local_b8 = 1.0;
            local_b4._0_4_ = 0.0;
            local_b4._4_4_ = 0.0;
            uStack_ac._0_4_ = 0.0;
            uStack_ac._4_4_ = 0.0;
            local_a4 = 1.0;
            local_a0._0_4_ = 0.0;
            local_a0._4_4_ = 0.0;
            uStack_98._0_4_ = 0.0;
            uStack_98._4_4_ = 0.0;
            local_90 = 1.0;
            local_8c._0_4_ = 0.0;
            local_8c._4_4_ = 0.0;
            uStack_84._0_4_ = 0.0;
            uStack_84._4_4_ = 0.0;
            local_7c._0_4_ = 1.0;
            local_7c._4_4_ = 1.0;
            local_74._0_4_ = 0.0;
            local_74._4_4_ = 0.0;
            uStack_6c._0_4_ = 0.0;
            uStack_6c._4_4_ = 0.0;
            local_64 = 1.0;
            local_60._0_4_ = 0.0;
            local_60._4_4_ = 0.0;
            uStack_58._0_4_ = 0.0;
            uStack_58._4_4_ = 0.0;
            local_50 = 1.0;
            local_4c._0_4_ = 0.0;
            local_4c._4_4_ = 0.0;
            uStack_44._0_4_ = 0.0;
            uStack_44._4_4_ = 0.0;
            local_3c = 1.0;
            std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
            emplace_back<Assimp::MD5::BoneDesc>(&this->mJoints,(BoneDesc *)local_4e8);
            pBVar6 = (this->mJoints).
                     super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar27 = (byte *)(pEVar25->szStart + 2);
            pcVar22 = pEVar25->szStart;
            do {
              pcVar14 = pcVar22;
              pbVar20 = pbVar27;
              pcVar22 = pcVar14 + 1;
              pbVar27 = pbVar20 + 1;
            } while (*pcVar14 != '\"');
            uVar18 = 0xffffffff;
            do {
              pbVar27 = pbVar20;
              uVar18 = uVar18 + 1;
              pcVar1 = pcVar14 + 1;
              pcVar14 = pcVar14 + 1;
              pbVar20 = pbVar27 + 1;
            } while (*pcVar1 != '\"');
            pBVar6[-1].super_BaseJointDescription.mName.length = uVar18;
            memcpy(pBVar6[-1].super_BaseJointDescription.mName.data,pcVar22,(ulong)uVar18);
            *(undefined1 *)((long)pBVar6 + ((ulong)uVar18 - 0x4b0)) = 0;
            while( true ) {
              bVar15 = *pbVar27;
              uVar13 = (ulong)bVar15;
              if (0x20 < uVar13) break;
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                  bVar15 = *pbVar27;
                }
                break;
              }
              pbVar27 = pbVar27 + 1;
            }
            pbVar27 = pbVar27 + ((bVar15 - 0x2b & 0xfd) == 0);
            bVar16 = *pbVar27;
            iVar7 = 0;
            if (0xf5 < (byte)(bVar16 - 0x3a)) {
              iVar7 = 0;
              do {
                iVar7 = (uint)(byte)(bVar16 - 0x30) + iVar7 * 10;
                bVar16 = pbVar27[1];
                pbVar27 = pbVar27 + 1;
              } while (0xf5 < (byte)(bVar16 - 0x3a));
            }
            iVar17 = -iVar7;
            if (bVar15 != 0x2d) {
              iVar17 = iVar7;
            }
            pBVar6[-1].super_BaseJointDescription.mParentIndex = iVar17;
            pbVar20 = pbVar27;
            while( true ) {
              pbVar20 = pbVar20 + 1;
              bVar15 = *pbVar27;
              uVar13 = (ulong)bVar15;
              if (0x20 < uVar13) break;
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                  bVar15 = *pbVar27;
                }
                break;
              }
              pbVar27 = pbVar27 + 1;
            }
            if (bVar15 != 0x28) {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar25->iLineNumber);
            }
            for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                }
                break;
              }
            }
            for (pbVar27 = (byte *)fast_atoreal_move<float>
                                             ((char *)pbVar20,&pBVar6[-1].mPositionXYZ.x,true);
                uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                }
                break;
              }
            }
            for (pbVar27 = (byte *)fast_atoreal_move<float>
                                             ((char *)pbVar27,&pBVar6[-1].mPositionXYZ.y,true);
                uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                }
                break;
              }
            }
            pbVar27 = (byte *)fast_atoreal_move<float>
                                        ((char *)pbVar27,&pBVar6[-1].mPositionXYZ.z,true);
            pbVar20 = pbVar27 + 2;
            while( true ) {
              bVar15 = *pbVar27;
              uVar13 = (ulong)bVar15;
              if (0x20 < uVar13) break;
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                  bVar15 = *pbVar27;
                }
                break;
              }
              pbVar27 = pbVar27 + 1;
              pbVar20 = pbVar20 + 1;
            }
            if (bVar15 != 0x29) {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar25->iLineNumber);
            }
            while( true ) {
              bVar15 = pbVar20[-1];
              uVar13 = (ulong)bVar15;
              if (0x20 < uVar13) break;
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                  bVar15 = pbVar20[-1];
                }
                break;
              }
              pbVar20 = pbVar20 + 1;
            }
            if (bVar15 != 0x28) {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar25->iLineNumber);
            }
            for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                }
                break;
              }
            }
            for (pbVar27 = (byte *)fast_atoreal_move<float>
                                             ((char *)pbVar20,&pBVar6[-1].mRotationQuat.x,true);
                uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                }
                break;
              }
            }
            for (pbVar27 = (byte *)fast_atoreal_move<float>
                                             ((char *)pbVar27,&pBVar6[-1].mRotationQuat.y,true);
                uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                }
                break;
              }
            }
            pbVar27 = (byte *)fast_atoreal_move<float>
                                        ((char *)pbVar27,&pBVar6[-1].mRotationQuat.z,true);
            while( true ) {
              bVar15 = *pbVar27;
              uVar13 = (ulong)bVar15;
              if (0x20 < uVar13) break;
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                  bVar15 = *pbVar27;
                }
                break;
              }
              pbVar27 = pbVar27 + 1;
            }
            if (bVar15 != 0x29) {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar25->iLineNumber);
            }
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)psVar2);
          if (iVar7 == 0) {
            memset((MeshDesc *)local_4e8,0,0x450);
            memset(local_49b,0x1b,0x3ff);
            std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::
            emplace_back<Assimp::MD5::MeshDesc>(&this->mMeshes,(MeshDesc *)local_4e8);
            std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_4b8);
            if (local_4d0 != (pointer)0x0) {
              operator_delete(local_4d0,(long)local_4c0 - (long)local_4d0);
            }
            if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ - local_4e8._0_8_);
            }
            pEVar25 = (pSVar24->mElements).
                      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar4 = (pSVar24->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pEVar25 != pEVar4) {
              pMVar5 = (this->mMeshes).
                       super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              this_00 = pMVar5 + -1;
              this_01 = &pMVar5[-1].mVertices;
              this_02 = &pMVar5[-1].mFaces;
              do {
                pbVar27 = (byte *)pEVar25->szStart;
                iVar7 = strncmp("shader",(char *)pbVar27,6);
                if (iVar7 == 0) {
                  bVar15 = pbVar27[6];
                  if ((0x20 < (ulong)bVar15) || ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) == 0))
                  goto LAB_0046bc8b;
                  pbVar20 = pbVar27 + 7;
                  if (bVar15 == 0) {
                    pbVar20 = pbVar27 + 6;
                  }
                  for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                    if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                      if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                        MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                      }
                      break;
                    }
                  }
                  do {
                    pbVar27 = pbVar20;
                    pbVar20 = pbVar27 + 1;
                  } while (*pbVar27 != 0x22);
                  uVar13 = 0xffffffffffffffff;
                  do {
                    lVar23 = uVar13 + 2;
                    uVar13 = uVar13 + 1;
                  } while (pbVar27[lVar23] != 0x22);
                  pMVar5[-1].mShader.length = (ai_uint32)uVar13;
                  memcpy(pMVar5[-1].mShader.data,pbVar27 + 1,uVar13 & 0xffffffff);
                  *(undefined1 *)((long)pMVar5 + ((uVar13 & 0xffffffff) - 0x404)) = 0;
                }
                else {
LAB_0046bc8b:
                  iVar7 = strncmp("numverts",(char *)pbVar27,8);
                  if (iVar7 == 0) {
                    bVar15 = pbVar27[8];
                    if (((ulong)bVar15 < 0x21) &&
                       ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
                      pbVar19 = pbVar27 + 9;
                      pbVar20 = pbVar27 + 9;
                      if (bVar15 == 0) {
                        pbVar19 = pbVar27 + 8;
                        pbVar20 = pbVar27 + 8;
                      }
                      while( true ) {
                        pbVar20 = pbVar20 + 1;
                        uVar13 = (ulong)*pbVar19;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar19;
                          }
                          break;
                        }
                        pbVar19 = pbVar19 + 1;
                      }
                      if ((byte)((char)uVar13 - 0x3aU) < 0xf6) {
                        sVar21 = 0;
                      }
                      else {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          bVar15 = *pbVar20;
                          uVar13 = (ulong)bVar15;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(bVar15 - 0x3a));
                        sVar21 = (size_type)uVar18;
                      }
                      std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                      ::resize(this_01,sVar21);
                      goto LAB_0046c692;
                    }
                  }
                  iVar7 = strncmp("numtris",(char *)pbVar27,7);
                  if (iVar7 == 0) {
                    bVar15 = pbVar27[7];
                    if (((ulong)bVar15 < 0x21) &&
                       ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
                      pbVar19 = pbVar27 + 8;
                      pbVar20 = pbVar27 + 8;
                      if (bVar15 == 0) {
                        pbVar19 = pbVar27 + 7;
                        pbVar20 = pbVar27 + 7;
                      }
                      while( true ) {
                        pbVar20 = pbVar20 + 1;
                        uVar13 = (ulong)*pbVar19;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar19;
                          }
                          break;
                        }
                        pbVar19 = pbVar19 + 1;
                      }
                      if ((byte)((char)uVar13 - 0x3aU) < 0xf6) {
                        sVar21 = 0;
                      }
                      else {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          bVar15 = *pbVar20;
                          uVar13 = (ulong)bVar15;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(bVar15 - 0x3a));
                        sVar21 = (size_type)uVar18;
                      }
                      std::vector<aiFace,_std::allocator<aiFace>_>::resize(this_02,sVar21);
                      goto LAB_0046c692;
                    }
                  }
                  iVar7 = strncmp("numweights",(char *)pbVar27,10);
                  if (iVar7 == 0) {
                    bVar15 = pbVar27[10];
                    if (((ulong)bVar15 < 0x21) &&
                       ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
                      pbVar19 = pbVar27 + 0xb;
                      pbVar20 = pbVar27 + 0xb;
                      if (bVar15 == 0) {
                        pbVar19 = pbVar27 + 10;
                        pbVar20 = pbVar27 + 10;
                      }
                      while( true ) {
                        pbVar20 = pbVar20 + 1;
                        uVar13 = (ulong)*pbVar19;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar19;
                          }
                          break;
                        }
                        pbVar19 = pbVar19 + 1;
                      }
                      if ((byte)((char)uVar13 - 0x3aU) < 0xf6) {
                        sVar21 = 0;
                      }
                      else {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          bVar15 = *pbVar20;
                          uVar13 = (ulong)bVar15;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(bVar15 - 0x3a));
                        sVar21 = (size_type)uVar18;
                      }
                      std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                      ::resize(&this_00->mWeights,sVar21);
                      goto LAB_0046c692;
                    }
                  }
                  iVar7 = strncmp("vert",(char *)pbVar27,4);
                  if (iVar7 == 0) {
                    bVar15 = pbVar27[4];
                    if (((ulong)bVar15 < 0x21) &&
                       ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
                      pbVar20 = pbVar27 + 5;
                      if (bVar15 == 0) {
                        pbVar20 = pbVar27 + 4;
                      }
                      for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar20;
                          }
                          break;
                        }
                      }
                      uVar18 = 0;
                      if (0xf5 < (byte)((char)uVar13 - 0x3aU)) {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          pbVar27 = pbVar20 + 1;
                          uVar13 = (ulong)*pbVar27;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(*pbVar27 - 0x3a));
                      }
                      while ((byte)uVar13 < 0x21) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                        pbVar27 = pbVar20 + 1;
                        pbVar20 = pbVar20 + 1;
                        uVar13 = (ulong)*pbVar27;
                      }
                      local_540 = pMVar5[-1].mVertices.
                                  super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      if ((ulong)((long)pMVar5[-1].mVertices.
                                        super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_540
                                 >> 4) <= (ulong)uVar18) {
                        std::
                        vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                        resize(this_01,(ulong)(uVar18 + 1));
                        local_540 = (this_01->
                                    super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                      }
                      if (*pbVar20 != 0x28) {
                        MD5Parser::ReportWarning
                                  ("Unexpected token: ( was expected",pEVar25->iLineNumber);
                      }
                      local_540 = local_540 + uVar18;
                      do {
                        pbVar20 = pbVar20 + 1;
                        uVar13 = (ulong)*pbVar20;
                        if (0x20 < uVar13) goto LAB_0046c148;
                      } while ((0x100000200U >> (uVar13 & 0x3f) & 1) != 0);
                      if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                        MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                      }
LAB_0046c148:
                      for (pbVar27 = (byte *)fast_atoreal_move<float>
                                                       ((char *)pbVar20,(float *)local_540,true);
                          uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                      }
                      pbVar20 = (byte *)fast_atoreal_move<float>
                                                  ((char *)pbVar27,&(local_540->mUV).y,true);
                      pbVar27 = pbVar20;
                      while( true ) {
                        pbVar20 = pbVar20 + 1;
                        bVar15 = *pbVar27;
                        uVar13 = (ulong)bVar15;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            bVar15 = *pbVar27;
                          }
                          break;
                        }
                        pbVar27 = pbVar27 + 1;
                      }
                      if (bVar15 != 0x29) {
                        MD5Parser::ReportWarning
                                  ("Unexpected token: ) was expected",pEVar25->iLineNumber);
                      }
                      for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar20;
                          }
                          break;
                        }
                      }
                      uVar18 = 0;
                      if (0xf5 < (byte)((char)uVar13 - 0x3aU)) {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          pbVar27 = pbVar20 + 1;
                          uVar13 = (ulong)*pbVar27;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(*pbVar27 - 0x3a));
                      }
                      local_540->mFirstWeight = uVar18;
                      pbVar27 = pbVar20;
                      while( true ) {
                        pbVar27 = pbVar27 + 1;
                        uVar13 = (ulong)*pbVar20;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar20;
                          }
                          break;
                        }
                        pbVar20 = pbVar20 + 1;
                      }
                      uVar18 = 0;
                      if (0xf5 < (byte)((char)uVar13 - 0x3aU)) {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          bVar15 = *pbVar27;
                          uVar13 = (ulong)bVar15;
                          pbVar27 = pbVar27 + 1;
                        } while (0xf5 < (byte)(bVar15 - 0x3a));
                      }
                      local_540->mNumWeights = uVar18;
                      goto LAB_0046c692;
                    }
                  }
                  iVar7 = *pbVar27 - 0x74;
                  if ((iVar7 == 0) && (iVar7 = pbVar27[1] - 0x72, iVar7 == 0)) {
                    iVar7 = 0x69 - (uint)pbVar27[2];
                  }
                  else {
                    iVar7 = -iVar7;
                  }
                  if (iVar7 == 0) {
                    bVar15 = pbVar27[3];
                    if (((ulong)bVar15 < 0x21) &&
                       ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
                      pbVar20 = pbVar27 + 4;
                      if (bVar15 == 0) {
                        pbVar20 = pbVar27 + 3;
                      }
                      for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar20;
                          }
                          break;
                        }
                      }
                      uVar12 = 0;
                      if (0xf5 < (byte)((char)uVar13 - 0x3aU)) {
                        uVar12 = 0;
                        do {
                          uVar12 = (ulong)((uint)(byte)((char)uVar13 - 0x30) + (int)uVar12 * 10);
                          pbVar27 = pbVar20 + 1;
                          uVar13 = (ulong)*pbVar27;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(*pbVar27 - 0x3a));
                      }
                      paVar26 = pMVar5[-1].mFaces.
                                super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      if ((ulong)((long)pMVar5[-1].mFaces.
                                        super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)paVar26 >> 4) <=
                          uVar12) {
                        std::vector<aiFace,_std::allocator<aiFace>_>::resize
                                  (this_02,(ulong)((int)uVar12 + 1));
                        paVar26 = (this_02->super__Vector_base<aiFace,_std::allocator<aiFace>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
                      }
                      paVar26[uVar12].mNumIndices = 3;
                      puVar9 = (uint *)operator_new__(0xc);
                      paVar26[uVar12].mIndices = puVar9;
                      lVar23 = 0;
LAB_0046c3b1:
                      do {
                        uVar13 = (ulong)*pbVar20;
                        if (uVar13 < 0x21) {
                          if ((0x100000200U >> (uVar13 & 0x3f) & 1) != 0) {
                            pbVar20 = pbVar20 + 1;
                            goto LAB_0046c3b1;
                          }
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar20;
                          }
                        }
                        uVar18 = 0;
                        if (0xf5 < (byte)((char)uVar13 - 0x3aU)) {
                          uVar18 = 0;
                          do {
                            uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                            pbVar27 = pbVar20 + 1;
                            uVar13 = (ulong)*pbVar27;
                            pbVar20 = pbVar20 + 1;
                          } while (0xf5 < (byte)(*pbVar27 - 0x3a));
                        }
                        paVar26[uVar12].mIndices[lVar23] = uVar18;
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != 3);
                      goto LAB_0046c692;
                    }
                  }
                  iVar7 = strncmp("weight",(char *)pbVar27,6);
                  if (iVar7 == 0) {
                    bVar15 = pbVar27[6];
                    if (((ulong)bVar15 < 0x21) &&
                       ((0x100003601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
                      pbVar20 = pbVar27 + 7;
                      if (bVar15 == 0) {
                        pbVar20 = pbVar27 + 6;
                      }
                      for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            uVar13 = (ulong)*pbVar20;
                          }
                          break;
                        }
                      }
                      uVar18 = 0;
                      if (0xf5 < (byte)((char)uVar13 - 0x3aU)) {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)((char)uVar13 - 0x30) + uVar18 * 10;
                          pbVar27 = pbVar20 + 1;
                          uVar13 = (ulong)*pbVar27;
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(*pbVar27 - 0x3a));
                      }
                      while ((byte)uVar13 < 0x21) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                        pbVar27 = pbVar20 + 1;
                        pbVar20 = pbVar20 + 1;
                        uVar13 = (ulong)*pbVar27;
                      }
                      uVar12 = (ulong)uVar18;
                      pWVar10 = pMVar5[-1].mWeights.
                                super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar13 = ((long)pMVar5[-1].mWeights.
                                      super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar10 >>
                               2) * -0x3333333333333333;
                      if (uVar13 < uVar12 || uVar13 - uVar12 == 0) {
                        std::
                        vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::
                        resize(&this_00->mWeights,(ulong)(uVar18 + 1));
                        pWVar10 = (this_00->mWeights).
                                  super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      bVar15 = *pbVar20;
                      uVar18 = 0;
                      if (0xf5 < (byte)(bVar15 - 0x3a)) {
                        uVar18 = 0;
                        do {
                          uVar18 = (uint)(byte)(bVar15 - 0x30) + uVar18 * 10;
                          bVar15 = pbVar20[1];
                          pbVar20 = pbVar20 + 1;
                        } while (0xf5 < (byte)(bVar15 - 0x3a));
                      }
                      pWVar10 = pWVar10 + uVar12;
                      pWVar10->mBone = uVar18;
                      for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                      }
                      pbVar20 = (byte *)fast_atoreal_move<float>
                                                  ((char *)pbVar20,&pWVar10->mWeight,true);
                      pbVar27 = pbVar20;
                      while( true ) {
                        pbVar20 = pbVar20 + 1;
                        bVar15 = *pbVar27;
                        uVar13 = (ulong)bVar15;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            bVar15 = *pbVar27;
                          }
                          break;
                        }
                        pbVar27 = pbVar27 + 1;
                      }
                      if (bVar15 != 0x28) {
                        MD5Parser::ReportWarning
                                  ("Unexpected token: ( was expected",pEVar25->iLineNumber);
                      }
                      for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                      }
                      for (pbVar27 = (byte *)fast_atoreal_move<float>
                                                       ((char *)pbVar20,
                                                        &(pWVar10->vOffsetPosition).x,true);
                          uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                      }
                      for (pbVar27 = (byte *)fast_atoreal_move<float>
                                                       ((char *)pbVar27,
                                                        &(pWVar10->vOffsetPosition).y,true);
                          uVar13 = (ulong)*pbVar27, uVar13 < 0x21; pbVar27 = pbVar27 + 1) {
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                          }
                          break;
                        }
                      }
                      pbVar27 = (byte *)fast_atoreal_move<float>
                                                  ((char *)pbVar27,&(pWVar10->vOffsetPosition).z,
                                                   true);
                      while( true ) {
                        bVar15 = *pbVar27;
                        uVar13 = (ulong)bVar15;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar25->iLineNumber);
                            bVar15 = *pbVar27;
                          }
                          break;
                        }
                        pbVar27 = pbVar27 + 1;
                      }
                      if (bVar15 != 0x29) {
                        MD5Parser::ReportWarning
                                  ("Unexpected token: ) was expected",pEVar25->iLineNumber);
                      }
                    }
                  }
                }
LAB_0046c692:
                pEVar25 = pEVar25 + 1;
              } while (pEVar25 != pEVar4);
            }
          }
        }
      }
    }
    pSVar24 = pSVar24 + 1;
  } while( true );
}

Assistant:

MD5MeshParser::MD5MeshParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5MeshParser begin");

    // now parse all sections
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter){
        if ( (*iter).mName == "numMeshes")  {
            mMeshes.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ( (*iter).mName == "numJoints") {
            mJoints.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "joints") {
            // "origin" -1 ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000000 0.707107 )
            for (const auto & elem : (*iter).mElements){
                mJoints.push_back(BoneDesc());
                BoneDesc& desc = mJoints.back();
				
                const char* sz = elem.szStart;
				AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // negative values, at least -1, is allowed here
                desc.mParentIndex = (int)strtol10(sz,&sz);

                AI_MD5_READ_TRIPLE(desc.mPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.mRotationQuat); // normalized quaternion, so w is not there
            }
        }
        else if ((*iter).mName == "mesh")   {
            mMeshes.push_back(MeshDesc());
            MeshDesc& desc = mMeshes.back();

            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                // shader attribute
                if (TokenMatch(sz,"shader",6))  {
                    AI_MD5_SKIP_SPACES();
                    AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mShader);
                }
                // numverts attribute
                else if (TokenMatch(sz,"numverts",8))   {
                    AI_MD5_SKIP_SPACES();
                    desc.mVertices.resize(strtoul10(sz));
                }
                // numtris attribute
                else if (TokenMatch(sz,"numtris",7))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mFaces.resize(strtoul10(sz));
                }
                // numweights attribute
                else if (TokenMatch(sz,"numweights",10))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mWeights.resize(strtoul10(sz));
                }
                // vert attribute
                // "vert 0 ( 0.394531 0.513672 ) 0 1"
                else if (TokenMatch(sz,"vert",4))   {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mVertices.size())
                        desc.mVertices.resize(idx+1);

                    VertexDesc& vert = desc.mVertices[idx];
                    if ('(' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ( was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.x);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.y);
                    AI_MD5_SKIP_SPACES();
                    if (')' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ) was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    vert.mFirstWeight = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    vert.mNumWeights = ::strtoul10(sz,&sz);
                }
                // tri attribute
                // "tri 0 15 13 12"
                else if (TokenMatch(sz,"tri",3)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= desc.mFaces.size())
                        desc.mFaces.resize(idx+1);

                    aiFace& face = desc.mFaces[idx];
                    face.mIndices = new unsigned int[face.mNumIndices = 3];
                    for (unsigned int i = 0; i < 3;++i) {
                        AI_MD5_SKIP_SPACES();
                        face.mIndices[i] = strtoul10(sz,&sz);
                    }
                }
                // weight attribute
                // "weight 362 5 0.500000 ( -3.553583 11.893474 9.719339 )"
                else if (TokenMatch(sz,"weight",6)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mWeights.size())
                        desc.mWeights.resize(idx+1);

                    WeightDesc& weight = desc.mWeights[idx];
                    weight.mBone = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,weight.mWeight);
                    AI_MD5_READ_TRIPLE(weight.vOffsetPosition);
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5MeshParser end");
}